

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialnonce.cpp
# Opt level: O3

void __thiscall
ConfidentialNonce_Constractor_sizeerr_Test::TestBody
          (ConfidentialNonce_Constractor_sizeerr_Test *this)

{
  bool bVar1;
  ConfidentialNonce nonce;
  AssertHelper local_60 [2];
  undefined1 local_50 [16];
  ConfidentialNonce local_40;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_60[0].data_ = (AssertHelperData *)local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"001122","");
    cfd::core::ConfidentialNonce::ConfidentialNonce(&local_40,(string *)local_60);
    if (local_60[0].data_ != (AssertHelperData *)local_50) {
      operator_delete(local_60[0].data_);
    }
    local_40._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_004e1260;
    if (local_40.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&local_40);
  testing::internal::AssertHelper::AssertHelper
            (local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialnonce.cpp"
             ,0x44,
             "Expected: ConfidentialNonce nonce(\"001122\") throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(local_60,(Message *)&local_40);
  testing::internal::AssertHelper::~AssertHelper(local_60);
  if (local_40._vptr_ConfidentialNonce != (_func_int **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_40._vptr_ConfidentialNonce != (_func_int **)0x0)) {
      (**(code **)(*local_40._vptr_ConfidentialNonce + 8))();
    }
  }
  return;
}

Assistant:

TEST(ConfidentialNonce, Constractor_sizeerr) {
  // error
  EXPECT_THROW(ConfidentialNonce nonce("001122"), CfdException);
}